

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToDouble(DecimalQuantity *this,double n)

{
  bool bVar1;
  uint uVar2;
  double local_18;
  double n_local;
  DecimalQuantity *this_local;
  
  setBcdToZero(this);
  this->flags = '\0';
  bVar1 = std::signbit(n);
  local_18 = n;
  if (bVar1) {
    this->flags = this->flags | ::(anonymous_namespace)::NEGATIVE_FLAG;
    local_18 = -n;
  }
  uVar2 = std::isnan(local_18);
  if ((uVar2 & 1) == 0) {
    bVar1 = std::isfinite(local_18);
    if (bVar1) {
      if ((local_18 != 0.0) || (NAN(local_18))) {
        _setToDoubleFast(this,local_18);
        compact(this);
      }
    }
    else {
      this->flags = this->flags | ::(anonymous_namespace)::INFINITY_FLAG;
    }
  }
  else {
    this->flags = this->flags | ::(anonymous_namespace)::NAN_FLAG;
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToDouble(double n) {
    setBcdToZero();
    flags = 0;
    // signbit() from <math.h> handles +0.0 vs -0.0
    if (std::signbit(n)) {
        flags |= NEGATIVE_FLAG;
        n = -n;
    }
    if (std::isnan(n) != 0) {
        flags |= NAN_FLAG;
    } else if (std::isfinite(n) == 0) {
        flags |= INFINITY_FLAG;
    } else if (n != 0) {
        _setToDoubleFast(n);
        compact();
    }
    return *this;
}